

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::
FieldRemover::FieldRemover(wasm::(anonymous)::GlobalTypeOptimization__
          (void *this,GlobalTypeOptimization *parent)

{
  GlobalTypeOptimization *parent_local;
  FieldRemover *this_local;
  
  WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_> *)this
            );
  *(undefined ***)this = &PTR__FieldRemover_0309bf30;
  *(GlobalTypeOptimization **)((long)this + 0x130) = parent;
  *(undefined1 *)((long)this + 0x138) = 0;
  return;
}

Assistant:

FieldRemover(GlobalTypeOptimization& parent) : parent(parent) {}